

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

bool __thiscall
HighsDomain::ConflictSet::explainInfeasibilityLeq
          (ConflictSet *this,HighsInt *inds,double *vals,HighsInt len,double rhs,double minAct)

{
  pointer *ppRVar1;
  pointer pRVar2;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  HighsDomain *pHVar4;
  pointer ppVar5;
  pointer pdVar6;
  iterator __position;
  pointer pRVar7;
  bool bVar8;
  long lVar9;
  int iVar10;
  NodeSetArray *pNVar11;
  pointer ppVar12;
  int *piVar13;
  ulong uVar14;
  HighsInt HVar15;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar16;
  double dVar17;
  HighsCDouble M;
  ResolveCandidate local_88;
  double local_68;
  vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
  *local_60;
  NodeSetArray *local_58;
  NodeSetArray *local_50;
  undefined1 local_48 [16];
  
  if (minAct <= -INFINITY) {
    return false;
  }
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = rhs;
  local_48._12_4_ = in_XMM0_Dd;
  HVar15 = 0x7fffffff;
  if (this->localdom->infeasible_ == true) {
    HVar15 = this->localdom->infeasible_pos;
  }
  local_60 = (vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
              *)&this->resolveBuffer;
  local_68 = minAct;
  std::
  vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  ::reserve((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             *)local_60,(long)len);
  pRVar2 = (this->resolveBuffer).
           super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolveBuffer).
      super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar2) {
    (this->resolveBuffer).
    super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar2;
  }
  if (0 < len) {
    _Var3._M_head_impl =
         (this->localdom->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    local_58 = (NodeSetArray *)((long)&(_Var3._M_head_impl)->nodequeue + 0x48);
    local_50 = (NodeSetArray *)((long)&(_Var3._M_head_impl)->nodequeue + 0x40);
    uVar14 = 0;
    do {
      lVar9 = (long)inds[uVar14];
      local_88.valuePos = (HighsInt)uVar14;
      dVar17 = vals[uVar14];
      pHVar4 = this->localdom;
      ppVar5 = (pHVar4->prevboundval_).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (dVar17 <= 0.0) {
        ppVar12 = (pointer)((pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar9);
        piVar13 = (pHVar4->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar9;
        while( true ) {
          dVar16 = ppVar12->first;
          local_88.boundPos = *piVar13;
          if ((local_88.boundPos <= HVar15) &&
             (((local_88.boundPos == -1 || (ppVar5[local_88.boundPos].first != dVar16)) ||
              (NAN(ppVar5[local_88.boundPos].first) || NAN(dVar16))))) break;
          ppVar12 = ppVar5 + local_88.boundPos;
          piVar13 = &ppVar5[local_88.boundPos].second;
        }
        pdVar6 = (this->globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_88.baseBound = pdVar6[lVar9];
        if ((local_88.boundPos != -1) && (dVar16 < local_88.baseBound)) {
          local_88.delta = dVar16 - local_88.baseBound;
          pNVar11 = local_58;
          goto LAB_0029f4ee;
        }
      }
      else {
        ppVar12 = (pointer)((pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar9);
        piVar13 = (pHVar4->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar9;
        while( true ) {
          dVar16 = ppVar12->first;
          local_88.boundPos = *piVar13;
          if ((local_88.boundPos <= HVar15) &&
             (((local_88.boundPos == -1 || (ppVar5[local_88.boundPos].first != dVar16)) ||
              (NAN(ppVar5[local_88.boundPos].first) || NAN(dVar16))))) break;
          ppVar12 = ppVar5 + local_88.boundPos;
          piVar13 = &ppVar5[local_88.boundPos].second;
        }
        pdVar6 = (this->globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_88.baseBound = pdVar6[lVar9];
        if ((local_88.boundPos != -1) && (local_88.baseBound < dVar16)) {
          local_88.delta = dVar16 - local_88.baseBound;
          pNVar11 = local_50;
LAB_0029f4ee:
          local_88.delta = local_88.delta * dVar17;
          local_88.prio =
               ABS((double)(*(long *)((long)pNVar11->_M_t + 0x30 + lVar9 * 0x38) + 1) *
                   (dVar16 - pdVar6[lVar9]) * dVar17);
          __position._M_current =
               (this->resolveBuffer).
               super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->resolveBuffer).
              super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
            ::_M_realloc_insert<HighsDomain::ConflictSet::ResolveCandidate_const&>
                      (local_60,__position,&local_88);
          }
          else {
            (__position._M_current)->prio = local_88.prio;
            (__position._M_current)->boundPos = local_88.boundPos;
            (__position._M_current)->valuePos = local_88.valuePos;
            (__position._M_current)->delta = local_88.delta;
            (__position._M_current)->baseBound = local_88.baseBound;
            ppRVar1 = &(this->resolveBuffer).
                       super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppRVar1 = *ppRVar1 + 1;
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)len);
  }
  pRVar2 = (this->resolveBuffer).
           super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar7 = (this->resolveBuffer).
           super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar7) {
    uVar14 = (long)pRVar7 - (long)pRVar2 >> 5;
    iVar10 = 0;
    if (1 < uVar14) {
      iVar10 = 0;
      do {
        uVar14 = (long)uVar14 >> 1;
        iVar10 = iVar10 + 1;
      } while (1 < uVar14);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::ResolveCandidate*,std::vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>>,std::less<HighsDomain::ConflictSet::ResolveCandidate>,false>
              (pRVar2,pRVar7,iVar10,1);
  }
  dVar17 = ABS((double)local_48._0_8_);
  if (dVar17 <= 10.0) {
    dVar17 = 10.0;
  }
  M.lo = 0.0;
  M.hi = local_68;
  bVar8 = resolveLinearLeq(this,M,dVar17 * ((this->localdom->mipsolver->mipdata_)._M_t.
                                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                           _M_head_impl)->feastol + (double)local_48._0_8_,vals);
  return bVar8;
}

Assistant:

bool HighsDomain::ConflictSet::explainInfeasibilityLeq(const HighsInt* inds,
                                                       const double* vals,
                                                       HighsInt len, double rhs,
                                                       double minAct) {
  if (minAct == -kHighsInf) return false;

  HighsInt infeasible_pos = kHighsIInf;
  if (localdom.infeasible_) infeasible_pos = localdom.infeasible_pos;

  resolveBuffer.reserve(len);
  resolveBuffer.clear();
  const auto& nodequeue = localdom.mipsolver->mipdata_->nodequeue;
  for (HighsInt i = 0; i < len; ++i) {
    HighsInt col = inds[i];

    ResolveCandidate cand;
    cand.valuePos = i;

    if (vals[i] > 0) {
      double lb = localdom.getColLowerPos(col, infeasible_pos, cand.boundPos);
      cand.baseBound = globaldom.col_lower_[col];
      if (cand.baseBound >= lb || cand.boundPos == -1) continue;
      cand.delta = vals[i] * (lb - cand.baseBound);
      cand.prio = computePrio(vals[i], lb, globaldom.col_lower_[col],
                              nodequeue.numNodesUp(col));
    } else {
      double ub = localdom.getColUpperPos(col, infeasible_pos, cand.boundPos);
      cand.baseBound = globaldom.col_upper_[col];
      if (cand.baseBound <= ub || cand.boundPos == -1) continue;
      cand.delta = vals[i] * (ub - cand.baseBound);
      cand.prio = computePrio(vals[i], ub, globaldom.col_upper_[col],
                              nodequeue.numNodesDown(col));
    }

    resolveBuffer.push_back(cand);
  }

  pdqsort(resolveBuffer.begin(), resolveBuffer.end());

  // compute the lower bound of M that is necessary
  double Mlower = rhs + std::max(10.0, std::fabs(rhs)) *
                            localdom.mipsolver->mipdata_->feastol;

  return resolveLinearLeq(minAct, Mlower, vals);
}